

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

TiXmlNode * __thiscall
TiXmlNode::ReplaceChild(TiXmlNode *this,TiXmlNode *replaceThis,TiXmlNode *withThis)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TiXmlNode *pTVar2;
  TiXmlDocument *this_00;
  TiXmlNode **ppTVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  if ((replaceThis != (TiXmlNode *)0x0) && (replaceThis->parent == this)) {
    iVar1 = (*(withThis->super_TiXmlBase)._vptr_TiXmlBase[4])(withThis);
    if (CONCAT44(extraout_var,iVar1) == 0) {
      iVar1 = (*(withThis->super_TiXmlBase)._vptr_TiXmlBase[0x10])(withThis);
      pTVar2 = (TiXmlNode *)CONCAT44(extraout_var_01,iVar1);
      if (pTVar2 != (TiXmlNode *)0x0) {
        pTVar2->next = replaceThis->next;
        pTVar2->prev = replaceThis->prev;
        ppTVar3 = &replaceThis->next->prev;
        if (replaceThis->next == (TiXmlNode *)0x0) {
          ppTVar3 = &this->lastChild;
        }
        *ppTVar3 = pTVar2;
        ppTVar3 = &replaceThis->prev->next;
        if (replaceThis->prev == (TiXmlNode *)0x0) {
          ppTVar3 = &this->firstChild;
        }
        *ppTVar3 = pTVar2;
        (*(replaceThis->super_TiXmlBase)._vptr_TiXmlBase[1])(replaceThis);
        pTVar2->parent = this;
        return pTVar2;
      }
    }
    else {
      this_00 = (TiXmlDocument *)0x0;
      do {
        iVar1 = (*(this->super_TiXmlBase)._vptr_TiXmlBase[4])(this);
        if (CONCAT44(extraout_var_00,iVar1) != 0) {
          iVar1 = (*(this->super_TiXmlBase)._vptr_TiXmlBase[4])(this);
          this_00 = (TiXmlDocument *)CONCAT44(extraout_var_02,iVar1);
          break;
        }
        this = this->parent;
      } while (this != (TiXmlNode *)0x0);
      if (this_00 != (TiXmlDocument *)0x0) {
        TiXmlDocument::SetError
                  (this_00,0xf,(char *)0x0,(TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
        return (TiXmlNode *)0x0;
      }
    }
  }
  return (TiXmlNode *)0x0;
}

Assistant:

TiXmlNode* TiXmlNode::ReplaceChild( TiXmlNode* replaceThis, const TiXmlNode& withThis )
{
	if ( !replaceThis )
		return 0;

	if ( replaceThis->parent != this )
		return 0;

	if ( withThis.ToDocument() ) {
		// A document can never be a child.	Thanks to Noam.
		TiXmlDocument* document = GetDocument();
		if ( document ) 
			document->SetError( TIXML_ERROR_DOCUMENT_TOP_ONLY, 0, 0, TIXML_ENCODING_UNKNOWN );
		return 0;
	}

	TiXmlNode* node = withThis.Clone();
	if ( !node )
		return 0;

	node->next = replaceThis->next;
	node->prev = replaceThis->prev;

	if ( replaceThis->next )
		replaceThis->next->prev = node;
	else
		lastChild = node;

	if ( replaceThis->prev )
		replaceThis->prev->next = node;
	else
		firstChild = node;

	delete replaceThis;
	node->parent = this;
	return node;
}